

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

void __thiscall
glslang::TParseContextBase::warn
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list args;
  char *szExtraInfoFormat_local;
  char *szToken_local;
  char *szReason_local;
  TSourceLoc *loc_local;
  TParseContextBase *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d0 = in_R9;
  args[0].reg_save_area = szExtraInfoFormat;
  bVar1 = TParseVersions::suppressWarnings(&this->super_TParseVersions);
  if (!bVar1) {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x28;
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x4c])
              (this,loc,szReason,szToken,args[0].reg_save_area,1,&local_48);
  }
  return;
}

Assistant:

void C_DECL TParseContextBase::warn(const TSourceLoc& loc, const char* szReason, const char* szToken,
                                    const char* szExtraInfoFormat, ...)
{
    if (suppressWarnings())
        return;
    va_list args;
    va_start(args, szExtraInfoFormat);
    outputMessage(loc, szReason, szToken, szExtraInfoFormat, EPrefixWarning, args);
    va_end(args);
}